

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O3

void __thiscall TestRunner::RunAll(TestRunner *this,TestSuite *ts)

{
  bool bVar1;
  TestCase **ppTVar2;
  uint uVar3;
  long lVar4;
  
  if (0 < (int)(ts->mTestCases).mSize) {
    lVar4 = 0;
    do {
      bVar1 = TestCase::Start((ts->mTestCases).mData[lVar4]);
      if (!bVar1) {
        exit(1);
      }
      ppTVar2 = (ts->mTestCases).mData;
      if (ppTVar2[lVar4] == (TestCase *)0x0) {
        uVar3 = (ts->mTestCases).mSize;
      }
      else {
        (*ppTVar2[lVar4]->_vptr_TestCase[1])();
        uVar3 = (ts->mTestCases).mSize;
        ppTVar2 = (ts->mTestCases).mData;
      }
      ppTVar2[lVar4] = (TestCase *)0x0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)uVar3);
  }
  return;
}

Assistant:

void RunAll( TestSuite &ts )
	{
		for( int i = 0; i < (int)ts.mTestCases.size(); i++ )
		{
			LOG_NOTICE( "Running test %s", ts.mTestCases[ i ]->GetTestName() );
			if ( ts.mTestCases[ i ]->Start() == false )
			{
				exit( EXIT_FAILURE );
			}
			delete ts.mTestCases[ i ];
			ts.mTestCases[ i ] = NULL;
		}
	}